

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_SetChaseThreshold
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  VMValue *pVVar2;
  AActor *pAVar3;
  bool bVar4;
  int local_64;
  int local_60;
  bool local_5b;
  AActor *mobj;
  int ptr;
  bool def;
  int threshold;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1956,
                  "int AF_AActor_A_SetChaseThreshold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar4 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar4 = true, (param->field_0).field_1.atag != 1)) {
    bVar4 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar4) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1956,
                  "int AF_AActor_A_SetChaseThreshold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar3 = (AActor *)(param->field_0).field_1.a;
  local_5b = true;
  if (pAVar3 != (AActor *)0x0) {
    local_5b = DObject::IsKindOf((DObject *)pAVar3,AActor::RegistrationInfo.MyClass);
  }
  if (local_5b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1956,
                  "int AF_AActor_A_SetChaseThreshold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1957,
                  "int AF_AActor_A_SetChaseThreshold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1957,
                  "int AF_AActor_A_SetChaseThreshold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  local_64 = param[1].field_0.i;
  if (numparam < 3) {
    pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
    if ((pVVar2->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1958,
                    "int AF_AActor_A_SetChaseThreshold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
    iVar1 = (pVVar2->field_0).i;
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1958,
                    "int AF_AActor_A_SetChaseThreshold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar1 = param[2].field_0.i;
  }
  if (numparam < 4) {
    pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
    if ((pVVar2->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1959,
                    "int AF_AActor_A_SetChaseThreshold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
    mobj._4_4_ = (pVVar2->field_0).i;
  }
  else {
    if (param[3].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1959,
                    "int AF_AActor_A_SetChaseThreshold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    mobj._4_4_ = param[3].field_0.i;
  }
  pAVar3 = COPY_AAPTR(pAVar3,mobj._4_4_);
  if (pAVar3 != (AActor *)0x0) {
    if (iVar1 == 0) {
      if (local_64 < 0) {
        local_64 = 0;
      }
      pAVar3->threshold = local_64;
    }
    else {
      local_60 = local_64;
      if (local_64 < 0) {
        local_60 = 0;
      }
      pAVar3->DefThreshold = local_60;
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetChaseThreshold)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(threshold);
	PARAM_BOOL_DEF(def);
	PARAM_INT_DEF(ptr);


	AActor *mobj = COPY_AAPTR(self, ptr);
	if (!mobj)
	{
		return 0;
	}
	if (def)
		mobj->DefThreshold = (threshold >= 0) ? threshold : 0;
	else
		mobj->threshold = (threshold >= 0) ? threshold : 0;
	return 0;
}